

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O1

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  void *pvVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    iVar4 = 0;
    goto LAB_0039ac9f;
  case 1:
    puStack_40 = (undefined8 *)_a[1];
    iVar4 = 1;
LAB_0039ac9f:
    local_48 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_48);
    break;
  case 2:
    setOpacity((QGraphicsOpacityEffect *)_o,*_a[1]);
    break;
  case 3:
    setOpacityMask((QGraphicsOpacityEffect *)_o,(QBrush *)_a[1]);
  }
  if (_c == ReadProperty) {
switchD_0039abfa_caseD_1:
    puVar2 = (undefined8 *)*_a;
    if (_id == 1) {
      QBrush::QBrush((QBrush *)&local_48,(QBrush *)(*(long *)(_o + 8) + 0xb0));
      pvVar3 = (void *)*puVar2;
      *puVar2 = local_48;
      local_48 = pvVar3;
      QBrush::~QBrush((QBrush *)&local_48);
    }
    else if (_id == 0) {
      *puVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0xa8);
    }
    if (_c != WriteProperty) goto switchD_0039abfa_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_0039abfa_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == opacityChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0039abfa_caseD_3;
    }
    if (((code *)*plVar1 == opacityMaskChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_0039abfa_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0039abfa_caseD_3;
      goto switchD_0039abfa_caseD_1;
    }
  }
  if (_id == 1) {
    setOpacityMask((QGraphicsOpacityEffect *)_o,(QBrush *)*_a);
  }
  else if (_id == 0) {
    setOpacity((QGraphicsOpacityEffect *)_o,*(qreal *)*_a);
  }
switchD_0039abfa_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsOpacityEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->opacityChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->opacityMaskChanged((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        case 2: _t->setOpacity((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setOpacityMask((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(qreal )>(_a, &QGraphicsOpacityEffect::opacityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(const QBrush & )>(_a, &QGraphicsOpacityEffect::opacityMaskChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->opacityMask(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setOpacityMask(*reinterpret_cast<QBrush*>(_v)); break;
        default: break;
        }
    }
}